

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::OnImportGlobal
          (BinaryReaderObjdumpPrepass *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  string *x;
  string *psVar1;
  string_view x_00;
  string_view name;
  string_view y;
  string local_70;
  string local_50;
  
  x = (string *)field_name._M_len;
  x_00._M_str = ".";
  x_00._M_len = (size_t)module_name._M_str;
  psVar1 = x;
  operator+[abi_cxx11_(&local_70,(wabt *)module_name._M_len,x_00,(char *)x);
  y._M_str = (char *)psVar1;
  y._M_len = (size_t)field_name._M_str;
  operator+(&local_50,(wabt *)&local_70,x,y);
  name._M_str = local_50._M_dataplus._M_p;
  name._M_len = local_50._M_string_length;
  SetGlobalName(this,global_index,name);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)Ok;
}

Assistant:

Result OnImportGlobal(Index import_index,
                        std::string_view module_name,
                        std::string_view field_name,
                        Index global_index,
                        Type type,
                        bool mutable_) override {
    SetGlobalName(global_index, module_name + "." + field_name);
    return Result::Ok;
  }